

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void autocorr(double *vec,int N,double *acorr,int M)

{
  double dVar1;
  int local_34;
  int i;
  double var;
  int M_local;
  double *acorr_local;
  int N_local;
  double *vec_local;
  
  if (N < M) {
    var._4_4_ = N + -1;
    printf(
          "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n"
          );
    printf("\n The Output Vector only contains N calculated values.");
  }
  else {
    var._4_4_ = M;
    if (M < 0) {
      var._4_4_ = 0;
    }
  }
  autocovar(vec,N,acorr,var._4_4_);
  dVar1 = *acorr;
  *acorr = 1.0;
  for (local_34 = 1; local_34 < var._4_4_; local_34 = local_34 + 1) {
    acorr[local_34] = acorr[local_34] / dVar1;
  }
  return;
}

Assistant:

void autocorr(double* vec,int N,double* acorr, int M) {
	double var;
	int i;
	if (M > N) {
		M = N - 1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	}
	else if (M < 0) {
		M = 0;
	}
	autocovar(vec,N,acorr,M);
	var = acorr[0];
	acorr[0] = 1.0;
	
	for(i = 1; i < M; i++) {
		acorr[i] = acorr[i]/var;
	}
	
}